

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  bool bVar1;
  TextAttributes *_attr;
  ostream *poVar2;
  TextAttributes local_b0;
  string local_88;
  Text local_68;
  Colour local_11;
  AssertionPrinter *pAStack_10;
  Colour colourGuard;
  AssertionPrinter *this_local;
  
  pAStack_10 = this;
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    std::operator<<(this->stream,"with expansion:\n");
    Colour::Colour(&local_11,ReconstructedExpression);
    poVar2 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_88,this->result);
    Tbc::TextAttributes::TextAttributes(&local_b0);
    _attr = Tbc::TextAttributes::setIndent(&local_b0,2);
    Tbc::Text::Text(&local_68,&local_88,_attr);
    poVar2 = Tbc::operator<<(poVar2,&local_68);
    std::operator<<(poVar2,'\n');
    Tbc::Text::~Text(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    Colour::~Colour(&local_11);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    stream << "with expansion:\n";
                    Colour colourGuard( Colour::ReconstructedExpression );
                    stream << Text( result.getExpandedExpression(), TextAttributes().setIndent(2) ) << '\n';
                }
            }